

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

void FAudio_INTERNAL_ResizeDecodeCache(FAudio *audio,uint32_t samples)

{
  float *pfVar1;
  
  FAudio_PlatformLockMutex(audio->sourceLock);
  if (audio->decodeSamples < samples) {
    audio->decodeSamples = samples;
    pfVar1 = (float *)(*audio->pRealloc)(audio->decodeCache,(ulong)samples << 2);
    audio->decodeCache = pfVar1;
  }
  FAudio_PlatformUnlockMutex(audio->sourceLock);
  return;
}

Assistant:

void FAudio_INTERNAL_ResizeDecodeCache(FAudio *audio, uint32_t samples)
{
	LOG_FUNC_ENTER(audio)
	FAudio_PlatformLockMutex(audio->sourceLock);
	LOG_MUTEX_LOCK(audio, audio->sourceLock)
	if (samples > audio->decodeSamples)
	{
		audio->decodeSamples = samples;
		audio->decodeCache = (float*) audio->pRealloc(
			audio->decodeCache,
			sizeof(float) * audio->decodeSamples
		);
	}
	FAudio_PlatformUnlockMutex(audio->sourceLock);
	LOG_MUTEX_UNLOCK(audio, audio->sourceLock)
	LOG_FUNC_EXIT(audio)
}